

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathRunStreamEval
              (xmlXPathContextPtr ctxt,xmlPatternPtr comp,xmlXPathObjectPtr *resultSeq,int toBool)

{
  xmlElementType xVar1;
  xmlGenericErrorFunc p_Var2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  xmlXPathObjectPtr pxVar10;
  xmlStreamCtxtPtr streamCtxt;
  xmlDocPtr val;
  xmlDocPtr val_00;
  xmlGenericErrorFunc *pp_Var11;
  void **ppvVar12;
  int iVar13;
  xmlChar *ns;
  xmlDocPtr local_38;
  
  if (comp == (xmlPatternPtr)0x0 || ctxt == (xmlXPathContextPtr)0x0) {
    return -1;
  }
  iVar5 = xmlPatternMaxDepth(comp);
  if (iVar5 == -1) {
    return -1;
  }
  iVar13 = 10000;
  if (iVar5 != -2) {
    iVar13 = iVar5;
  }
  iVar5 = xmlPatternMinDepth(comp);
  if (iVar5 == -1) {
    return -1;
  }
  iVar6 = xmlPatternFromRoot(comp);
  if (iVar6 < 0) {
    return -1;
  }
  if (toBool == 0) {
    if (resultSeq == (xmlXPathObjectPtr *)0x0) {
      return -1;
    }
    pxVar10 = xmlXPathCacheNewNodeSet(ctxt,(xmlNodePtr)0x0);
    *resultSeq = pxVar10;
    if (pxVar10 == (xmlXPathObjectPtr)0x0) {
      return -1;
    }
  }
  if (iVar5 == 0) {
    if (iVar6 != 0) {
      if (toBool != 0) {
        return 1;
      }
      xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)ctxt->doc);
      goto LAB_001d6f85;
    }
    if (toBool != 0) {
      return 1;
    }
    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,ctxt->node);
    if (iVar13 == 0) {
      return 0;
    }
LAB_001d702e:
    val = (xmlDocPtr)ctxt->node;
    if (val == (xmlDocPtr)0x0) {
      return 0;
    }
    uVar7 = val->type - XML_ELEMENT_NODE;
    uVar3 = uVar7 >> 1;
    if (6 < (uVar3 | (uint)((uVar7 & 1) != 0) << 0x1f)) {
      return 0;
    }
    bVar4 = true;
    local_38 = val;
    if ((0x71U >> (uVar3 & 0x1f) & 1) == 0) {
      return 0;
    }
  }
  else {
LAB_001d6f85:
    if (iVar13 == 0) {
      return 0;
    }
    if (iVar6 == 0) goto LAB_001d702e;
    val = ctxt->doc;
    if (val == (xmlDocPtr)0x0) {
      return 0;
    }
    local_38 = (xmlDocPtr)0x0;
    bVar4 = false;
  }
  streamCtxt = xmlPatternGetStreamCtxt(comp);
  if (streamCtxt == (xmlStreamCtxtPtr)0x0) {
    return 0;
  }
  iVar5 = 1;
  iVar6 = xmlStreamWantsAnyNode(streamCtxt);
  if ((!bVar4) && (iVar8 = xmlStreamPush(streamCtxt,(xmlChar *)0x0,(xmlChar *)0x0), iVar8 == 1)) {
    if (toBool != 0) goto LAB_001d7281;
    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)val);
  }
  iVar8 = 0;
LAB_001d70c4:
  if (val->type != XML_NAMESPACE_DECL) {
    val_00 = (xmlDocPtr)val->children;
    if ((((val_00 != (xmlDocPtr)0x0) && (iVar8 < iVar13)) && (val_00->type != XML_ENTITY_DECL)) &&
       (iVar8 = iVar8 + 1, val = val_00, val_00->type != XML_DTD_NODE)) goto LAB_001d7177;
    if (val != local_38) {
      do {
        val_00 = (xmlDocPtr)val->next;
        if (val_00 == (xmlDocPtr)0x0) goto LAB_001d7117;
        val = val_00;
      } while ((val_00->type == XML_DTD_NODE) || (val_00->type == XML_ENTITY_DECL));
      goto LAB_001d7183;
    }
  }
LAB_001d727a:
  iVar5 = 0;
LAB_001d7281:
  xmlFreeStreamCtxt(streamCtxt);
  return iVar5;
LAB_001d7117:
  do {
    val = (xmlDocPtr)val->parent;
    if ((val == (xmlDocPtr)0x0) || (val == local_38)) goto LAB_001d727a;
    xVar1 = val->type;
    if (xVar1 == XML_ELEMENT_NODE) {
LAB_001d7154:
      xmlStreamPop(streamCtxt);
    }
    else {
      if (xVar1 == XML_DOCUMENT_NODE) goto LAB_001d727a;
      if (((iVar6 != 0) && (xVar1 < XML_DOCUMENT_NODE)) &&
         ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) goto LAB_001d7154;
    }
    val_00 = (xmlDocPtr)val->next;
    iVar8 = iVar8 + -1;
  } while (val_00 == (xmlDocPtr)0x0);
LAB_001d7177:
  if (-1 < iVar8) {
LAB_001d7183:
    do {
      if (ctxt->opLimit != 0) {
        if (ctxt->opLimit <= ctxt->opCount) {
          pp_Var11 = __xmlGenericError();
          p_Var2 = *pp_Var11;
          ppvVar12 = __xmlGenericErrorContext();
          (*p_Var2)(*ppvVar12,"XPath operation limit exceeded\n");
          iVar5 = -1;
          goto LAB_001d7281;
        }
        ctxt->opCount = ctxt->opCount + 1;
      }
      xVar1 = val_00->type;
      val = val_00;
      if (XML_COMMENT_NODE < xVar1) goto LAB_001d70c4;
      if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        if (xVar1 != XML_ELEMENT_NODE) goto LAB_001d70c4;
        if (*(xmlNs **)&val_00->compression == (xmlNs *)0x0) {
          ns = (xmlChar *)0x0;
        }
        else {
          ns = (*(xmlNs **)&val_00->compression)->href;
        }
        iVar9 = xmlStreamPush(streamCtxt,(xmlChar *)val_00->name,ns);
      }
      else {
        if (iVar6 == 0) goto LAB_001d70c4;
        iVar9 = xmlStreamPushNode(streamCtxt,(xmlChar *)0x0,(xmlChar *)0x0,xVar1);
      }
      if (iVar9 == 1) {
        if (toBool != 0) goto LAB_001d7281;
        iVar9 = xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)val_00);
        if (iVar9 < 0) {
          (ctxt->lastError).domain = 0xc;
          (ctxt->lastError).code = 2;
        }
      }
      if ((val_00->children != (_xmlNode *)0x0) && (iVar8 < iVar13)) goto LAB_001d70c4;
      xmlStreamPop(streamCtxt);
      do {
        val_00 = (xmlDocPtr)val->next;
        if (val_00 == (xmlDocPtr)0x0) goto LAB_001d70c4;
        val = val_00;
      } while ((val_00->type == XML_DTD_NODE) || (val_00->type == XML_ENTITY_DECL));
    } while( true );
  }
  goto LAB_001d727a;
}

Assistant:

static int
xmlXPathRunStreamEval(xmlXPathContextPtr ctxt, xmlPatternPtr comp,
		      xmlXPathObjectPtr *resultSeq, int toBool)
{
    int max_depth, min_depth;
    int from_root;
    int ret, depth;
    int eval_all_nodes;
    xmlNodePtr cur = NULL, limit = NULL;
    xmlStreamCtxtPtr patstream = NULL;

    if ((ctxt == NULL) || (comp == NULL))
        return(-1);
    max_depth = xmlPatternMaxDepth(comp);
    if (max_depth == -1)
        return(-1);
    if (max_depth == -2)
        max_depth = 10000;
    min_depth = xmlPatternMinDepth(comp);
    if (min_depth == -1)
        return(-1);
    from_root = xmlPatternFromRoot(comp);
    if (from_root < 0)
        return(-1);
#if 0
    printf("stream eval: depth %d from root %d\n", max_depth, from_root);
#endif

    if (! toBool) {
	if (resultSeq == NULL)
	    return(-1);
	*resultSeq = xmlXPathCacheNewNodeSet(ctxt, NULL);
	if (*resultSeq == NULL)
	    return(-1);
    }

    /*
     * handle the special cases of "/" amd "." being matched
     */
    if (min_depth == 0) {
	if (from_root) {
	    /* Select "/" */
	    if (toBool)
		return(1);
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,
		                     (xmlNodePtr) ctxt->doc);
	} else {
	    /* Select "self::node()" */
	    if (toBool)
		return(1);
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, ctxt->node);
	}
    }
    if (max_depth == 0) {
	return(0);
    }

    if (from_root) {
        cur = (xmlNodePtr)ctxt->doc;
    } else if (ctxt->node != NULL) {
        switch (ctxt->node->type) {
            case XML_ELEMENT_NODE:
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
	        cur = ctxt->node;
		break;
            case XML_ATTRIBUTE_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
            case XML_NOTATION_NODE:
            case XML_DTD_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_ELEMENT_DECL:
            case XML_ATTRIBUTE_DECL:
            case XML_ENTITY_DECL:
            case XML_NAMESPACE_DECL:
            case XML_XINCLUDE_START:
            case XML_XINCLUDE_END:
		break;
	}
	limit = cur;
    }
    if (cur == NULL) {
        return(0);
    }

    patstream = xmlPatternGetStreamCtxt(comp);
    if (patstream == NULL) {
	/*
	* QUESTION TODO: Is this an error?
	*/
	return(0);
    }

    eval_all_nodes = xmlStreamWantsAnyNode(patstream);

    if (from_root) {
	ret = xmlStreamPush(patstream, NULL, NULL);
	if (ret < 0) {
	} else if (ret == 1) {
	    if (toBool)
		goto return_1;
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, cur);
	}
    }
    depth = 0;
    goto scan_children;
next_node:
    do {
        if (ctxt->opLimit != 0) {
            if (ctxt->opCount >= ctxt->opLimit) {
                xmlGenericError(xmlGenericErrorContext,
                        "XPath operation limit exceeded\n");
                xmlFreeStreamCtxt(patstream);
                return(-1);
            }
            ctxt->opCount++;
        }

	switch (cur->type) {
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
		if (cur->type == XML_ELEMENT_NODE) {
		    ret = xmlStreamPush(patstream, cur->name,
				(cur->ns ? cur->ns->href : NULL));
		} else if (eval_all_nodes)
		    ret = xmlStreamPushNode(patstream, NULL, NULL, cur->type);
		else
		    break;

		if (ret < 0) {
		    /* NOP. */
		} else if (ret == 1) {
		    if (toBool)
			goto return_1;
		    if (xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, cur)
		        < 0) {
			ctxt->lastError.domain = XML_FROM_XPATH;
			ctxt->lastError.code = XML_ERR_NO_MEMORY;
		    }
		}
		if ((cur->children == NULL) || (depth >= max_depth)) {
		    ret = xmlStreamPop(patstream);
		    while (cur->next != NULL) {
			cur = cur->next;
			if ((cur->type != XML_ENTITY_DECL) &&
			    (cur->type != XML_DTD_NODE))
			    goto next_node;
		    }
		}
	    default:
		break;
	}

scan_children:
	if (cur->type == XML_NAMESPACE_DECL) break;
	if ((cur->children != NULL) && (depth < max_depth)) {
	    /*
	     * Do not descend on entities declarations
	     */
	    if (cur->children->type != XML_ENTITY_DECL) {
		cur = cur->children;
		depth++;
		/*
		 * Skip DTDs
		 */
		if (cur->type != XML_DTD_NODE)
		    continue;
	    }
	}

	if (cur == limit)
	    break;

	while (cur->next != NULL) {
	    cur = cur->next;
	    if ((cur->type != XML_ENTITY_DECL) &&
		(cur->type != XML_DTD_NODE))
		goto next_node;
	}

	do {
	    cur = cur->parent;
	    depth--;
	    if ((cur == NULL) || (cur == limit) ||
                (cur->type == XML_DOCUMENT_NODE))
	        goto done;
	    if (cur->type == XML_ELEMENT_NODE) {
		ret = xmlStreamPop(patstream);
	    } else if ((eval_all_nodes) &&
		((cur->type == XML_TEXT_NODE) ||
		 (cur->type == XML_CDATA_SECTION_NODE) ||
		 (cur->type == XML_COMMENT_NODE) ||
		 (cur->type == XML_PI_NODE)))
	    {
		ret = xmlStreamPop(patstream);
	    }
	    if (cur->next != NULL) {
		cur = cur->next;
		break;
	    }
	} while (cur != NULL);

    } while ((cur != NULL) && (depth >= 0));

done:

    if (patstream)
	xmlFreeStreamCtxt(patstream);
    return(0);

return_1:
    if (patstream)
	xmlFreeStreamCtxt(patstream);
    return(1);
}